

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void ra_append_move_range
               (roaring_array_t *ra,roaring_array_t *sa,int32_t start_index,int32_t end_index)

{
  long lVar1;
  int iVar2;
  
  extend_array(ra,end_index - start_index);
  if (start_index < end_index) {
    lVar1 = (long)start_index;
    iVar2 = ra->size;
    do {
      ra->keys[iVar2] = sa->keys[lVar1];
      ra->containers[iVar2] = sa->containers[lVar1];
      ra->typecodes[iVar2] = sa->typecodes[lVar1];
      iVar2 = ra->size + 1;
      ra->size = iVar2;
      lVar1 = lVar1 + 1;
    } while (end_index != lVar1);
  }
  return;
}

Assistant:

void ra_append_move_range(roaring_array_t *ra, roaring_array_t *sa,
                          int32_t start_index, int32_t end_index) {
    extend_array(ra, end_index - start_index);

    for (int32_t i = start_index; i < end_index; ++i) {
        const int32_t pos = ra->size;

        ra->keys[pos] = sa->keys[i];
        ra->containers[pos] = sa->containers[i];
        ra->typecodes[pos] = sa->typecodes[i];
        ra->size++;
    }
}